

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::benchmarkFailed(ConsoleReporter *this,string *error)

{
  type tp;
  TablePrinter *pTVar1;
  char local_2d [20];
  Colour local_19;
  string *psStack_18;
  Colour colour;
  string *error_local;
  ConsoleReporter *this_local;
  
  psStack_18 = error;
  Colour::Colour(&local_19,Red);
  tp = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::
       operator*(&this->m_tablePrinter);
  pTVar1 = Catch::operator<<(tp,(char (*) [19])"Benchmark failed (");
  pTVar1 = Catch::operator<<(pTVar1,psStack_18);
  local_2d[0] = ')';
  pTVar1 = Catch::operator<<(pTVar1,local_2d);
  pTVar1 = Catch::operator<<(pTVar1);
  Catch::operator<<(pTVar1);
  Colour::~Colour(&local_19);
  return;
}

Assistant:

void ConsoleReporter::benchmarkFailed(std::string const& error) {
	Colour colour(Colour::Red);
    (*m_tablePrinter)
        << "Benchmark failed (" << error << ')'
        << ColumnBreak() << RowBreak();
}